

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> * __thiscall
testing::internal::linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_>::
operator=(linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *this,
         linked_ptr<const_testing::MatcherInterface<fmt::BasicStringRef<char>_>_> *ptr)

{
  if (ptr != this) {
    depart(this);
    linked_ptr<testing::MatcherInterface<fmt::BasicStringRef<char>>const>::
    copy<testing::MatcherInterface<fmt::BasicStringRef<char>>const>
              ((linked_ptr<testing::MatcherInterface<fmt::BasicStringRef<char>>const> *)this,ptr);
  }
  return this;
}

Assistant:

linked_ptr& operator=(linked_ptr const& ptr) {
    if (&ptr != this) {
      depart();
      copy(&ptr);
    }
    return *this;
  }